

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::SetBuffer(FileStdio *this,char *buffer,size_t size)

{
  int iVar1;
  FILE *__stream;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  __stream = (FILE *)this->m_File;
  if (__stream == (FILE *)0x0) {
    this->m_DelayedBufferSet = true;
    this->m_DelayedBuffer = buffer;
    this->m_DelayedBufferSize = size;
  }
  else {
    this->m_DelayedBufferSet = false;
    this->m_DelayedBuffer = (char *)0x0;
    this->m_DelayedBufferSize = 0;
    if (buffer == (char *)0x0) {
      if (size != 0) {
        std::__cxx11::string::string((string *)&local_48,"Toolkit",(allocator *)&local_28);
        std::__cxx11::string::string((string *)&local_68,"transport::file::FileStdio",&local_a9);
        std::__cxx11::string::string((string *)&local_88,"SetBuffer",&local_aa);
        std::__cxx11::string::string
                  ((string *)&local_a8,"buffer size must be 0 when using a NULL buffer",&local_ab);
        helper::Throw<std::invalid_argument>(&local_48,&local_68,&local_88,&local_a8,-1);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_48);
        __stream = (FILE *)this->m_File;
      }
      iVar1 = 2;
      buffer = (char *)0x0;
      size = 0;
    }
    else {
      iVar1 = 0;
    }
    iVar1 = setvbuf(__stream,buffer,iVar1,size);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_48,"Toolkit",&local_a9);
      std::__cxx11::string::string((string *)&local_68,"transport::file::FileStdio",&local_aa);
      std::__cxx11::string::string((string *)&local_88,"SetBuffer",&local_ab);
      std::operator+(&local_28,"could not set FILE* buffer in file ",&(this->super_Transport).m_Name
                    );
      std::operator+(&local_a8,&local_28,", in call to stdio setvbuf");
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_48,&local_68,&local_88,&local_a8,-1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return;
}

Assistant:

void FileStdio::SetBuffer(char *buffer, size_t size)
{
    if (!m_File)
    {
        m_DelayedBufferSet = true;
        m_DelayedBuffer = buffer;
        m_DelayedBufferSize = size;
        return;
    }
    m_DelayedBufferSet = false;
    m_DelayedBuffer = nullptr;
    m_DelayedBufferSize = 0;

    int status;
    if (buffer)
    {
        status = std::setvbuf(m_File, buffer, _IOFBF, size);
    }
    else
    {
        if (size != 0)
        {
            helper::Throw<std::invalid_argument>("Toolkit", "transport::file::FileStdio",
                                                 "SetBuffer",
                                                 "buffer size must be 0 when using a NULL buffer");
        }
        status = std::setvbuf(m_File, NULL, _IONBF, 0);
    }

    if (status)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "SetBuffer",
                                              "could not set FILE* buffer in file " + m_Name +
                                                  ", in call to stdio setvbuf");
    }
}